

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

NewOpRequirements __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GetNewOp
          (MessageGenerator *this,Printer *arena_emitter)

{
  Options *options;
  FieldDescriptor FVar1;
  FieldDescriptor *pFVar2;
  bool bVar3;
  char cVar4;
  ArenaDtorNeeds AVar5;
  FileOptions_OptimizeMode FVar6;
  int iVar7;
  FieldGenerator *pFVar8;
  string *psVar9;
  int3 iVar10;
  long lVar11;
  uint3 uVar12;
  bool bVar13;
  string_view suffix;
  FieldDescriptor *field;
  size_t arena_seeding_count;
  Iterator __begin3;
  anon_class_24_3_fa050984 print_arena_offset;
  Iterator __end3;
  FieldDescriptor *local_a0;
  size_t local_98;
  Printer *local_90;
  LogMessageFatal local_88 [16];
  Iterator local_78;
  MessageGenerator *local_68;
  FieldGeneratorTable *local_60;
  anon_class_24_3_fa050984 local_58;
  Iterator local_40;
  
  local_98 = 0;
  options = &this->options_;
  local_90 = arena_emitter;
  bVar3 = IsBootstrapProto(options,*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (bVar3) {
    bVar3 = true;
    uVar12 = 0;
    iVar10 = 0;
  }
  else {
    AVar5 = NeedsArenaDestructor(this);
    if (*(int *)(this->descriptor_ + 0x88) < 1) {
      iVar10 = 0;
    }
    else {
      local_98 = local_98 + 1;
      iVar10 = 1;
      if (local_90 != (Printer *)0x0) {
        google::protobuf::io::Printer::Emit
                  (local_90,0,0,0xc1,
                   "\n        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +\n            decltype($classname$::$extensions$)::InternalGetArenaOffset(\n                $superclass$::internal_visibility()),\n      "
                  );
      }
    }
    bVar13 = this->num_weak_fields_ != 0;
    local_78.descriptor = this->descriptor_;
    local_78.idx = 0;
    local_40.idx = *(int *)(local_78.descriptor + 4);
    local_40.descriptor = local_78.descriptor;
    bVar3 = protobuf::internal::operator==(&local_78,&local_40);
    if (bVar3) {
      uVar12 = 0;
    }
    else {
      local_60 = &this->field_generators_;
      uVar12 = 0;
      local_68 = this;
      do {
        local_a0 = Descriptor::field(local_78.descriptor,local_78.idx);
        local_58.arena_seeding_count = &local_98;
        local_58.arena_emitter = &local_90;
        local_58.field = &local_a0;
        bVar3 = ShouldSplit(local_a0,options);
        if (bVar3) {
          uVar12 = 1;
        }
        else {
          if ((char)local_a0[3] < '\0') {
            if (((byte)local_a0[1] & 0x10) == 0) {
              lVar11 = 0;
            }
            else {
              lVar11 = *(long *)(local_a0 + 0x28);
              if (lVar11 == 0) {
                google::protobuf::internal::protobuf_assumption_failed
                          ("res != nullptr",
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                           ,0xa9a);
              }
            }
            if (lVar11 == 0) goto LAB_0020f70b;
            if ((*(int *)(lVar11 + 4) == 1) && ((*(byte *)(*(long *)(lVar11 + 0x30) + 1) & 2) != 0))
            {
              GetNewOp();
              goto LAB_0020f6ca;
            }
            if ((char)local_a0[3] < '\0') goto LAB_0020f64a;
          }
          if ((local_a0[2] == (FieldDescriptor)0xb) &&
             (cVar4 = google::protobuf::FieldDescriptor::is_map_message_type(), cVar4 != '\0')) {
            GetNewOp::anon_class_24_3_fa050984::operator()
                      (&local_58,(string_view)(ZEXT816(0x344549) << 0x40));
            FVar6 = GetOptimizeFor(*(FileDescriptor **)(local_68->descriptor_ + 0x10),options,
                                   (bool *)0x0);
            uVar12 = 1;
            if (FVar6 != FileOptions_OptimizeMode_LITE_RUNTIME) {
              suffix._M_str = "Alt";
              suffix._M_len = 3;
              GetNewOp::anon_class_24_3_fa050984::operator()(&local_58,suffix);
            }
            iVar10 = 1;
          }
          else {
            pFVar2 = local_a0;
            FVar1 = local_a0[1];
            bVar3 = (bool)(((byte)FVar1 & 0x20) >> 5);
            if (0xbf < (byte)FVar1 == bVar3) {
              psVar9 = (string *)0x0;
            }
            else {
              psVar9 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                 (bVar3,0xbf < (byte)FVar1,
                                  "is_repeated_ == label() == LABEL_REPEATED");
            }
            if (psVar9 != (string *)0x0) {
LAB_0020f6fe:
              GetNewOp();
LAB_0020f70b:
              google::protobuf::internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                         ,0xac6);
            }
            if (((byte)pFVar2[1] & 0x20) == 0) {
              pFVar8 = FieldGeneratorTable::get(local_60,local_a0);
              if (((pFVar8->impl_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>
                  ._M_head_impl)->has_trivial_zero_default_ == false) {
                iVar7 = *(int *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                                (ulong)(byte)local_a0[2] * 4);
                if (iVar7 - 1U < 8) {
                  uVar12 = 1;
                }
                else if (iVar7 == 9) {
                  iVar7 = google::protobuf::FieldDescriptor::cpp_string_type();
                  if (iVar7 != 2) {
                    uVar12 = 1;
                  }
                  if (iVar7 == 2 && (!bVar13 && AVar5 != kRequired)) {
                    GetNewOp();
                    goto LAB_0020f6fe;
                  }
                }
                else if (iVar7 == 10) {
LAB_0020f6ca:
                  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                            (local_88,
                             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
                             ,0xf35);
                  absl::lts_20240722::log_internal::LogMessage::operator<<
                            ((LogMessage *)local_88,
                             (char (*) [38])"Message should be zero initializable.");
                  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
                }
              }
            }
            else {
              GetNewOp::anon_class_24_3_fa050984::operator()
                        (&local_58,(string_view)(ZEXT816(0x344549) << 0x40));
              iVar10 = 1;
            }
          }
        }
LAB_0020f64a:
        local_78.idx = local_78.idx + 1;
        bVar3 = protobuf::internal::operator==(&local_78,&local_40);
      } while (!bVar3);
    }
    bVar3 = 0x3f < local_98 || (bVar13 || AVar5 == kRequired);
  }
  return (NewOpRequirements)(uVar12 | iVar10 << 8 | (uint3)bVar3 << 0x10);
}

Assistant:

MessageGenerator::NewOpRequirements MessageGenerator::GetNewOp(
    io::Printer* arena_emitter) const {
  size_t arena_seeding_count = 0;
  NewOpRequirements op;
  if (IsBootstrapProto(options_, descriptor_->file())) {
    // To simplify bootstrapping we always use a function for these types.
    // It makes it easier to change the ABI of the `MessageCreator` class.
    op.needs_to_run_constructor = true;
    return op;
  }

  if (NeedsArenaDestructor() == ArenaDtorNeeds::kRequired) {
    // We can't skip the ArenaDtor for these messages.
    op.needs_to_run_constructor = true;
  }

  if (descriptor_->extension_range_count() > 0) {
    op.needs_arena_seeding = true;
    ++arena_seeding_count;
    if (arena_emitter) {
      arena_emitter->Emit(R"cc(
        PROTOBUF_FIELD_OFFSET($classname$, $extensions$) +
            decltype($classname$::$extensions$)::InternalGetArenaOffset(
                $superclass$::internal_visibility()),
      )cc");
    }
  }

  if (num_weak_fields_ != 0) {
    op.needs_to_run_constructor = true;
  }

  for (const FieldDescriptor* field : FieldRange(descriptor_)) {
    const auto print_arena_offset = [&](absl::string_view suffix = "") {
      ++arena_seeding_count;
      if (arena_emitter) {
        arena_emitter->Emit(
            {{"field", FieldMemberName(field, false)}, {"suffix", suffix}},
            R"cc(
              PROTOBUF_FIELD_OFFSET($classname$, $field$) +
                  decltype($classname$::$field$)::
                      InternalGetArenaOffset$suffix$(
                          $superclass$::internal_visibility()),
            )cc");
      }
    };
    if (ShouldSplit(field, options_)) {
      op.needs_memcpy = true;
    } else if (field->real_containing_oneof() != nullptr) {
      /* nothing to do */
    } else if (field->is_map()) {
      op.needs_arena_seeding = true;
      // MapField contains an internal vtable pointer we need to copy.
      op.needs_memcpy = true;
      print_arena_offset();
      // Non-lite maps currently have more than one arena pointer in them. Print
      // both.
      if (HasDescriptorMethods(descriptor_->file(), options_)) {
        print_arena_offset("Alt");
      }
    } else if (field->is_repeated()) {
      op.needs_arena_seeding = true;
      print_arena_offset();
    } else {
      const auto& generator = field_generators_.get(field);
      if (generator.has_trivial_zero_default()) {
        /* nothing to do */
      } else {
        switch (field->cpp_type()) {
          case FieldDescriptor::CPPTYPE_INT32:
          case FieldDescriptor::CPPTYPE_INT64:
          case FieldDescriptor::CPPTYPE_UINT32:
          case FieldDescriptor::CPPTYPE_UINT64:
          case FieldDescriptor::CPPTYPE_DOUBLE:
          case FieldDescriptor::CPPTYPE_FLOAT:
          case FieldDescriptor::CPPTYPE_BOOL:
          case FieldDescriptor::CPPTYPE_ENUM:
            op.needs_memcpy = true;
            break;

          case FieldDescriptor::CPPTYPE_STRING:
            switch (internal::cpp::EffectiveStringCType(field)) {
              case FieldOptions::STRING_PIECE:
                op.needs_arena_seeding = true;
                print_arena_offset();
                break;
              case FieldOptions::CORD:
                // Cord fields are currently rejected above because of ArenaDtor
                // requirements.
                ABSL_CHECK(op.needs_to_run_constructor);
                break;
              case FieldOptions::STRING:
                op.needs_memcpy = true;
                break;
              default:
                ABSL_LOG(FATAL);
            }
            break;
          case FieldDescriptor::CPPTYPE_MESSAGE:
            ABSL_LOG(FATAL) << "Message should be zero initializable.";
            break;
        }
      }
    }
  }

  // If we are going to generate too many arena seeding offsets, we can skip the
  // attempt because we know it will fail at compile time and fallback to
  // placement new. The arena seeding code can handle up to an offset of
  // `63 * sizeof(Arena*)`.
  // This prevents generating huge lists that have to be run during constant
  // evaluation to just fail anyway. The actual upper bound is smaller than
  // this, but any reasonable value is enough to prevent long compile times for
  // big messages.
  if (arena_seeding_count >= 64) {
    op.needs_to_run_constructor = true;
  }

  return op;
}